

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetSymbolFromPropertyId(JsPropertyIdRef propertyId,JsValueRef *symbol)

{
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  undefined4 *puVar4;
  JavascriptSymbol *pJVar5;
  JsErrorCode JVar6;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  pJVar3 = JsrtContext::GetCurrent();
  JVar6 = JsErrorNoCurrentContext;
  if (pJVar3 != (JsrtContext *)0x0) {
    this = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (this->TTDShouldPerformRecordAction == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0xd68,"(false)","Need to implement support here!!!");
      if (!bVar2) goto LAB_003842a5;
      *puVar4 = 0;
    }
    JVar6 = JsErrorInvalidArgument;
    if ((propertyId != (JsPropertyIdRef)0x0) && (0xf < *(uint *)((long)propertyId + 8))) {
      if (symbol == (JsValueRef *)0x0) {
        JVar6 = JsErrorNullArgument;
      }
      else {
        *symbol = (JsValueRef)0x0;
        JVar6 = JsErrorPropertyNotSymbol;
        if (*(char *)((long)propertyId + 0x12) == '\x01') {
          pJVar5 = Js::ScriptContext::GetSymbol(this,(PropertyRecord *)propertyId);
          *symbol = pJVar5;
          JVar6 = JsNoError;
        }
      }
    }
    if (JVar6 - JsErrorNoCurrentContext < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0x11f,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
LAB_003842a5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  }
  return JVar6;
}

Assistant:

CHAKRA_API JsGetSymbolFromPropertyId(_In_ JsPropertyIdRef propertyId, _Out_ JsValueRef *symbol)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(symbol);
        *symbol = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;
        if (!propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotSymbol;
        }

        *symbol = scriptContext->GetSymbol(propertyRecord);
        return JsNoError;
    });
}